

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

bool __thiscall
tinyusdz::Stage::find_prim_by_prim_id(Stage *this,uint64_t prim_id,Prim **prim,string *err)

{
  _Rb_tree_header *p_Var1;
  Prim *pPVar2;
  bool bVar3;
  mapped_type *ppPVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  string *in_R8;
  Prim *pPVar7;
  bool bVar8;
  Prim *p;
  Prim *local_40;
  uint64_t local_38;
  
  local_38 = prim_id;
  if (prim_id == 0) {
    if (err == (string *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = false;
      ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x40484f);
    }
  }
  else {
    if (this->_prim_id_dirty == true) {
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
      ::_M_erase(&(this->_prim_id_cache)._M_t,
                 (_Link_type)
                 (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      p_Var1 = &(this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      this->_prim_id_dirty = false;
    }
    else {
      p_Var1 = &(this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < prim_id]
          ) {
        if (*(ulong *)(p_Var6 + 1) >= prim_id) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var6 = p_Var5, prim_id < *(ulong *)(p_Var5 + 1))) {
        p_Var6 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 != p_Var1) {
        *prim = (Prim *)p_Var6[1]._M_parent;
        return true;
      }
    }
    local_40 = (mapped_type)0x0;
    pPVar7 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = pPVar7 != pPVar2;
    if (bVar8) {
      bVar3 = anon_unknown_28::FindPrimByPrimIdRec(local_38,pPVar7,&local_40,0,in_R8);
      if (!bVar3) {
        do {
          pPVar7 = pPVar7 + 1;
          bVar8 = pPVar7 != pPVar2;
          if (pPVar7 == pPVar2) {
            return bVar8;
          }
          bVar3 = anon_unknown_28::FindPrimByPrimIdRec(local_38,pPVar7,&local_40,0,in_R8);
        } while (!bVar3);
      }
      pPVar7 = local_40;
      ppPVar4 = ::std::
                map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
                ::operator[](&this->_prim_id_cache,&local_38);
      *ppPVar4 = pPVar7;
      *prim = local_40;
    }
  }
  return bVar8;
}

Assistant:

bool Stage::find_prim_by_prim_id(const uint64_t prim_id, const Prim *&prim,
                                 std::string *err) const {
  if (prim_id < 1) {
    if (err) {
      (*err) = "Input prim_id must be 1 or greater.";
    }
    return false;
  }

  if (_prim_id_dirty) {
    DCOUT("clear prim_id cache.");
    // Clear cache.
    _prim_id_cache.clear();

    _prim_id_dirty = false;
  } else {
    // First find from a cache.
    auto ret = _prim_id_cache.find(prim_id);
    if (ret != _prim_id_cache.end()) {
      DCOUT("Found cache.");
      prim = ret->second;
      return true;
    }
  }

  const Prim *p{nullptr};
  for (const auto &root : root_prims()) {
    if (FindPrimByPrimIdRec(prim_id, &root, &p, 0, err)) {
      _prim_id_cache[prim_id] = p;
      prim = p;
      return true;
    }
  }

  return false;
}